

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_gtest_utils.cpp
# Opt level: O1

void __thiscall unodb::test::QSBRTestBase::QSBRTestBase(QSBRTestBase *this)

{
  qsbr *this_00;
  long in_FS_OFFSET;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__QSBRTestBase_00177d50;
  (this->last_epoch).epoch_val = '\0';
  allocation_failure_injector::fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)1;
  qsbr_per_thread::current_thread_instance::__tls_init();
  allocation_failure_injector::fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  if (*(char *)(*(long *)(in_FS_OFFSET + -0x10) + 0x50) == '\x01') {
    qsbr_per_thread::current_thread_instance::__tls_init();
    qsbr_per_thread::qsbr_resume(*(qsbr_per_thread **)(in_FS_OFFSET + -0x10));
  }
  expect_idle_qsbr();
  this_00 = qsbr::instance();
  qsbr::reset_stats(this_00);
  return;
}

Assistant:

QSBRTestBase::QSBRTestBase() {
  if (is_qsbr_paused()) unodb::this_thread().qsbr_resume();
  unodb::test::expect_idle_qsbr();
#ifdef UNODB_DETAIL_WITH_STATS
  unodb::qsbr::instance().reset_stats();
#endif  // UNODB_DETAIL_WITH_STATS
}